

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int userauth_keyboard_interactive
              (LIBSSH2_SESSION *session,char *username,uint username_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  int iVar1;
  uchar *puVar2;
  uint local_40;
  uint i;
  int rc;
  uchar *s;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *response_callback_local;
  char *pcStack_20;
  uint username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  s = (uchar *)response_callback;
  response_callback_local._4_4_ = username_len;
  pcStack_20 = username;
  username_local = (char *)session;
  if (session->userauth_kybd_state == libssh2_NB_state_idle) {
    session->userauth_kybd_auth_name = (uchar *)0x0;
    session->userauth_kybd_auth_instruction = (uchar *)0x0;
    session->userauth_kybd_num_prompts = 0;
    session->userauth_kybd_auth_failure = 1;
    session->userauth_kybd_prompts = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    session->userauth_kybd_responses = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
    memset(&session->userauth_kybd_packet_requirev_state,0,8);
    *(ulong *)(username_local + 0x11a90) = (ulong)(response_callback_local._4_4_ + 0x37);
    puVar2 = (uchar *)(**(code **)(username_local + 8))
                                (*(undefined8 *)(username_local + 0x11a90),username_local);
    *(uchar **)(username_local + 0x11a78) = puVar2;
    if (puVar2 == (uchar *)0x0) {
      _i = puVar2;
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-6,
                             "Unable to allocate memory for keyboard-interactive authentication");
      return iVar1;
    }
    _i = puVar2 + 1;
    *puVar2 = '2';
    _libssh2_store_str((uchar **)&i,pcStack_20,(ulong)response_callback_local._4_4_);
    _libssh2_store_str((uchar **)&i,"ssh-connection",0xe);
    _libssh2_store_str((uchar **)&i,"keyboard-interactive",0x14);
    _libssh2_store_u32((uchar **)&i,0);
    _libssh2_store_u32((uchar **)&i,0);
    username_local[0x11a70] = '\x02';
    username_local[0x11a71] = '\0';
    username_local[0x11a72] = '\0';
    username_local[0x11a73] = '\0';
  }
  if (*(int *)(username_local + 0x11a70) == 2) {
    iVar1 = _libssh2_transport_send
                      ((LIBSSH2_SESSION *)username_local,*(uchar **)(username_local + 0x11a78),
                       *(size_t *)(username_local + 0x11a90),(uchar *)0x0,0);
    if (iVar1 == -0x25) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x25,"Would block");
      return iVar1;
    }
    if (iVar1 != 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x11a78),username_local)
      ;
      username_local[0x11a78] = '\0';
      username_local[0x11a79] = '\0';
      username_local[0x11a7a] = '\0';
      username_local[0x11a7b] = '\0';
      username_local[0x11a7c] = '\0';
      username_local[0x11a7d] = '\0';
      username_local[0x11a7e] = '\0';
      username_local[0x11a7f] = '\0';
      username_local[0x11a70] = '\0';
      username_local[0x11a71] = '\0';
      username_local[0x11a72] = '\0';
      username_local[0x11a73] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-7,
                             "Unable to send keyboard-interactive request");
      return iVar1;
    }
    (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x11a78),username_local);
    username_local[0x11a78] = '\0';
    username_local[0x11a79] = '\0';
    username_local[0x11a7a] = '\0';
    username_local[0x11a7b] = '\0';
    username_local[0x11a7c] = '\0';
    username_local[0x11a7d] = '\0';
    username_local[0x11a7e] = '\0';
    username_local[0x11a7f] = '\0';
    username_local[0x11a70] = '\x03';
    username_local[0x11a71] = '\0';
    username_local[0x11a72] = '\0';
    username_local[0x11a73] = '\0';
  }
  do {
    if (*(int *)(username_local + 0x11a70) == 3) {
      iVar1 = _libssh2_packet_requirev
                        ((LIBSSH2_SESSION *)username_local,"43<",
                         (uchar **)(username_local + 0x11a78),(size_t *)(username_local + 0x11a80),0
                         ,(uchar *)0x0,0,(packet_requirev_state_t *)(username_local + 0x11ad0));
      if (iVar1 == -0x25) {
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x25,"Would block");
        return iVar1;
      }
      if ((iVar1 != 0) || (*(long *)(username_local + 0x11a80) == 0)) {
        username_local[0x11a70] = '\0';
        username_local[0x11a71] = '\0';
        username_local[0x11a72] = '\0';
        username_local[0x11a73] = '\0';
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x12,
                               "Waiting for keyboard USERAUTH response");
        return iVar1;
      }
      if (**(char **)(username_local + 0x11a78) == '4') {
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0x11a78),username_local);
        username_local[0x11a78] = '\0';
        username_local[0x11a79] = '\0';
        username_local[0x11a7a] = '\0';
        username_local[0x11a7b] = '\0';
        username_local[0x11a7c] = '\0';
        username_local[0x11a7d] = '\0';
        username_local[0x11a7e] = '\0';
        username_local[0x11a7f] = '\0';
        *(uint *)(username_local + 0x80) = *(uint *)(username_local + 0x80) | 8;
        username_local[0x11a70] = '\0';
        username_local[0x11a71] = '\0';
        username_local[0x11a72] = '\0';
        username_local[0x11a73] = '\0';
        return 0;
      }
      if (**(char **)(username_local + 0x11a78) == '3') {
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0x11a78),username_local);
        username_local[0x11a78] = '\0';
        username_local[0x11a79] = '\0';
        username_local[0x11a7a] = '\0';
        username_local[0x11a7b] = '\0';
        username_local[0x11a7c] = '\0';
        username_local[0x11a7d] = '\0';
        username_local[0x11a7e] = '\0';
        username_local[0x11a7f] = '\0';
        username_local[0x11a70] = '\0';
        username_local[0x11a71] = '\0';
        username_local[0x11a72] = '\0';
        username_local[0x11a73] = '\0';
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x12,
                               "Authentication failed (keyboard-interactive)");
        return iVar1;
      }
      iVar1 = userauth_keyboard_interactive_decode_info_request((LIBSSH2_SESSION *)username_local);
      if (-1 < iVar1) {
        (*(code *)s)(*(undefined8 *)(username_local + 0x11aa0),
                     *(ulong *)(username_local + 0x11a98) & 0xffffffff,
                     *(undefined8 *)(username_local + 0x11ab0),
                     *(undefined8 *)(username_local + 0x11aa8),
                     *(undefined4 *)(username_local + 0x11ab8),
                     *(undefined8 *)(username_local + 0x11ac0),
                     *(undefined8 *)(username_local + 0x11ac8),username_local);
        username_local[0x11a90] = '\x05';
        username_local[0x11a91] = '\0';
        username_local[0x11a92] = '\0';
        username_local[0x11a93] = '\0';
        username_local[0x11a94] = '\0';
        username_local[0x11a95] = '\0';
        username_local[0x11a96] = '\0';
        username_local[0x11a97] = '\0';
        for (local_40 = 0; local_40 < *(uint *)(username_local + 0x11ab8); local_40 = local_40 + 1)
        {
          if (-*(long *)(username_local + 0x11a90) - 5U <
              (ulong)*(uint *)(*(long *)(username_local + 0x11ac8) + (ulong)local_40 * 0x10 + 8)) {
            _libssh2_error((LIBSSH2_SESSION *)username_local,-6,
                           "Unable to allocate memory for keyboard-interactive response packet");
            goto LAB_00142591;
          }
          *(ulong *)(username_local + 0x11a90) =
               (ulong)(*(int *)(*(long *)(username_local + 0x11ac8) + (ulong)local_40 * 0x10 + 8) +
                      4) + *(long *)(username_local + 0x11a90);
        }
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0x11a78),username_local);
        _i = (uchar *)(**(code **)(username_local + 8))
                                (*(undefined8 *)(username_local + 0x11a90),username_local);
        *(uchar **)(username_local + 0x11a78) = _i;
        if (_i != (uchar *)0x0) {
          *_i = '=';
          _i = _i + 1;
          _libssh2_store_u32((uchar **)&i,*(uint32_t *)(username_local + 0x11ab8));
          for (local_40 = 0; local_40 < *(uint *)(username_local + 0x11ab8); local_40 = local_40 + 1
              ) {
            _libssh2_store_str((uchar **)&i,
                               *(char **)(*(long *)(username_local + 0x11ac8) +
                                         (ulong)local_40 * 0x10),
                               (ulong)*(uint *)(*(long *)(username_local + 0x11ac8) +
                                                (ulong)local_40 * 0x10 + 8));
          }
          username_local[0x11a70] = '\x04';
          username_local[0x11a71] = '\0';
          username_local[0x11a72] = '\0';
          username_local[0x11a73] = '\0';
          goto LAB_0014250a;
        }
        _libssh2_error((LIBSSH2_SESSION *)username_local,-6,
                       "Unable to allocate memory for keyboard-interactive response packet");
      }
    }
    else {
LAB_0014250a:
      if (*(int *)(username_local + 0x11a70) == 4) {
        iVar1 = _libssh2_transport_send
                          ((LIBSSH2_SESSION *)username_local,*(uchar **)(username_local + 0x11a78),
                           *(size_t *)(username_local + 0x11a90),(uchar *)0x0,0);
        if (iVar1 == -0x25) {
          iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x25,"Would block");
          return iVar1;
        }
        if (iVar1 == 0) {
          username_local[0x11abc] = '\0';
          username_local[0x11abd] = '\0';
          username_local[0x11abe] = '\0';
          username_local[0x11abf] = '\0';
        }
        else {
          _libssh2_error((LIBSSH2_SESSION *)username_local,-7,
                         "Unable to send userauth-keyboard-interactive request");
        }
      }
    }
LAB_00142591:
    (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x11a78),username_local);
    username_local[0x11a78] = '\0';
    username_local[0x11a79] = '\0';
    username_local[0x11a7a] = '\0';
    username_local[0x11a7b] = '\0';
    username_local[0x11a7c] = '\0';
    username_local[0x11a7d] = '\0';
    username_local[0x11a7e] = '\0';
    username_local[0x11a7f] = '\0';
    if (*(long *)(username_local + 0x11ac0) != 0) {
      for (local_40 = 0; local_40 < *(uint *)(username_local + 0x11ab8); local_40 = local_40 + 1) {
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(*(long *)(username_local + 0x11ac0) + (ulong)local_40 * 0x18),
                   username_local);
        *(undefined8 *)(*(long *)(username_local + 0x11ac0) + (ulong)local_40 * 0x18) = 0;
      }
    }
    if (*(long *)(username_local + 0x11ac8) != 0) {
      for (local_40 = 0; local_40 < *(uint *)(username_local + 0x11ab8); local_40 = local_40 + 1) {
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(*(long *)(username_local + 0x11ac8) + (ulong)local_40 * 0x10),
                   username_local);
        *(undefined8 *)(*(long *)(username_local + 0x11ac8) + (ulong)local_40 * 0x10) = 0;
      }
    }
    if (*(long *)(username_local + 0x11ac0) != 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x11ac0),username_local)
      ;
      username_local[0x11ac0] = '\0';
      username_local[0x11ac1] = '\0';
      username_local[0x11ac2] = '\0';
      username_local[0x11ac3] = '\0';
      username_local[0x11ac4] = '\0';
      username_local[0x11ac5] = '\0';
      username_local[0x11ac6] = '\0';
      username_local[0x11ac7] = '\0';
    }
    if (*(long *)(username_local + 0x11ac8) != 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x11ac8),username_local)
      ;
      username_local[0x11ac8] = '\0';
      username_local[0x11ac9] = '\0';
      username_local[0x11aca] = '\0';
      username_local[0x11acb] = '\0';
      username_local[0x11acc] = '\0';
      username_local[0x11acd] = '\0';
      username_local[0x11ace] = '\0';
      username_local[0x11acf] = '\0';
    }
    if (*(long *)(username_local + 0x11aa0) != 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x11aa0),username_local)
      ;
      username_local[0x11aa0] = '\0';
      username_local[0x11aa1] = '\0';
      username_local[0x11aa2] = '\0';
      username_local[0x11aa3] = '\0';
      username_local[0x11aa4] = '\0';
      username_local[0x11aa5] = '\0';
      username_local[0x11aa6] = '\0';
      username_local[0x11aa7] = '\0';
    }
    if (*(long *)(username_local + 0x11ab0) != 0) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x11ab0),username_local)
      ;
      username_local[0x11ab0] = '\0';
      username_local[0x11ab1] = '\0';
      username_local[0x11ab2] = '\0';
      username_local[0x11ab3] = '\0';
      username_local[0x11ab4] = '\0';
      username_local[0x11ab5] = '\0';
      username_local[0x11ab6] = '\0';
      username_local[0x11ab7] = '\0';
    }
    if (*(int *)(username_local + 0x11abc) != 0) {
      username_local[0x11a70] = '\0';
      username_local[0x11a71] = '\0';
      username_local[0x11a72] = '\0';
      username_local[0x11a73] = '\0';
      return -1;
    }
    username_local[0x11a70] = '\x03';
    username_local[0x11a71] = '\0';
    username_local[0x11a72] = '\0';
    username_local[0x11a73] = '\0';
  } while( true );
}

Assistant:

static int
userauth_keyboard_interactive(LIBSSH2_SESSION * session,
                              const char *username,
                              unsigned int username_len,
                              LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                  ((*response_callback)))
{
    unsigned char *s;

    int rc;

    static const unsigned char reply_codes[4] = {
        SSH_MSG_USERAUTH_SUCCESS,
        SSH_MSG_USERAUTH_FAILURE, SSH_MSG_USERAUTH_INFO_REQUEST, 0
    };
    unsigned int i;

    if(session->userauth_kybd_state == libssh2_NB_state_idle) {
        session->userauth_kybd_auth_name = NULL;
        session->userauth_kybd_auth_instruction = NULL;
        session->userauth_kybd_num_prompts = 0;
        session->userauth_kybd_auth_failure = 1;
        session->userauth_kybd_prompts = NULL;
        session->userauth_kybd_responses = NULL;

        /* Zero the whole thing out */
        memset(&session->userauth_kybd_packet_requirev_state, 0,
               sizeof(session->userauth_kybd_packet_requirev_state));

        session->userauth_kybd_packet_len =
            1                   /* byte    SSH_MSG_USERAUTH_REQUEST */
            + 4 + username_len  /* string  user name (ISO-10646 UTF-8, as
                                   defined in [RFC-3629]) */
            + 4 + 14            /* string  service name (US-ASCII) */
            + 4 + 20            /* string  "keyboard-interactive" (US-ASCII) */
            + 4 + 0             /* string  language tag (as defined in
                                   [RFC-3066]) */
            + 4 + 0             /* string  submethods (ISO-10646 UTF-8) */
            ;

        session->userauth_kybd_data = s =
            LIBSSH2_ALLOC(session, session->userauth_kybd_packet_len);
        if(!s) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "keyboard-interactive authentication");
        }

        *s++ = SSH_MSG_USERAUTH_REQUEST;

        /* user name */
        _libssh2_store_str(&s, username, username_len);

        /* service name */
        _libssh2_store_str(&s, "ssh-connection", sizeof("ssh-connection") - 1);

        /* "keyboard-interactive" */
        _libssh2_store_str(&s, "keyboard-interactive",
                           sizeof("keyboard-interactive") - 1);
        /* language tag */
        _libssh2_store_u32(&s, 0);

        /* submethods */
        _libssh2_store_u32(&s, 0);

        _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                       "Attempting keyboard-interactive authentication"));

        session->userauth_kybd_state = libssh2_NB_state_created;
    }

    if(session->userauth_kybd_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, session->userauth_kybd_data,
                                     session->userauth_kybd_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                  "Would block");
        }
        else if(rc) {
            LIBSSH2_FREE(session, session->userauth_kybd_data);
            session->userauth_kybd_data = NULL;
            session->userauth_kybd_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send keyboard-interactive"
                                  " request");
        }
        LIBSSH2_FREE(session, session->userauth_kybd_data);
        session->userauth_kybd_data = NULL;

        session->userauth_kybd_state = libssh2_NB_state_sent;
    }

    for(;;) {
        if(session->userauth_kybd_state == libssh2_NB_state_sent) {
            rc = _libssh2_packet_requirev(session, reply_codes,
                                          &session->userauth_kybd_data,
                                          &session->userauth_kybd_data_len,
                                          0, NULL, 0,
                                          &session->
                                          userauth_kybd_packet_requirev_state);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                return _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                      "Would block");
            }
            else if(rc || session->userauth_kybd_data_len < 1) {
                session->userauth_kybd_state = libssh2_NB_state_idle;
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_AUTHENTICATION_FAILED,
                                      "Waiting for keyboard "
                                      "USERAUTH response");
            }

            if(session->userauth_kybd_data[0] == SSH_MSG_USERAUTH_SUCCESS) {
                _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                               "Keyboard-interactive "
                               "authentication successful"));
                LIBSSH2_FREE(session, session->userauth_kybd_data);
                session->userauth_kybd_data = NULL;
                session->state |= LIBSSH2_STATE_AUTHENTICATED;
                session->userauth_kybd_state = libssh2_NB_state_idle;
                return 0;
            }

            if(session->userauth_kybd_data[0] == SSH_MSG_USERAUTH_FAILURE) {
                _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                               "Keyboard-interactive authentication failed"));
                LIBSSH2_FREE(session, session->userauth_kybd_data);
                session->userauth_kybd_data = NULL;
                session->userauth_kybd_state = libssh2_NB_state_idle;
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_AUTHENTICATION_FAILED,
                                      "Authentication failed "
                                      "(keyboard-interactive)");
            }

            /* server requested PAM-like conversation */
            if(userauth_keyboard_interactive_decode_info_request(session)
               < 0) {
                goto cleanup;
            }

            response_callback((const char *)session->userauth_kybd_auth_name,
                              (int)session->userauth_kybd_auth_name_len,
                              (const char *)
                              session->userauth_kybd_auth_instruction,
                              (int)session->userauth_kybd_auth_instruction_len,
                              session->userauth_kybd_num_prompts,
                              session->userauth_kybd_prompts,
                              session->userauth_kybd_responses,
                              &session->abstract);

            _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                           "Keyboard-interactive response callback function"
                           " invoked"));

            session->userauth_kybd_packet_len =
                1    /* byte      SSH_MSG_USERAUTH_INFO_RESPONSE */
                + 4  /* int       num-responses */
                ;

            for(i = 0; i < session->userauth_kybd_num_prompts; i++) {
                /* string    response[1] (ISO-10646 UTF-8) */
                if(session->userauth_kybd_responses[i].length <=
                   (SIZE_MAX - 4 - session->userauth_kybd_packet_len)) {
                    session->userauth_kybd_packet_len +=
                        4 + session->userauth_kybd_responses[i].length;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                   "Unable to allocate memory for keyboard-"
                                   "interactive response packet");
                    goto cleanup;
                }
            }

            /* A new userauth_kybd_data area is to be allocated, free the
               former one. */
            LIBSSH2_FREE(session, session->userauth_kybd_data);

            session->userauth_kybd_data = s =
                LIBSSH2_ALLOC(session, session->userauth_kybd_packet_len);
            if(!s) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate memory for keyboard-"
                               "interactive response packet");
                goto cleanup;
            }

            *s = SSH_MSG_USERAUTH_INFO_RESPONSE;
            s++;
            _libssh2_store_u32(&s, session->userauth_kybd_num_prompts);

            for(i = 0; i < session->userauth_kybd_num_prompts; i++) {
                _libssh2_store_str(&s,
                                   session->userauth_kybd_responses[i].text,
                                   session->userauth_kybd_responses[i].length);
            }

            session->userauth_kybd_state = libssh2_NB_state_sent1;
        }

        if(session->userauth_kybd_state == libssh2_NB_state_sent1) {
            rc = _libssh2_transport_send(session, session->userauth_kybd_data,
                                         session->userauth_kybd_packet_len,
                                         NULL, 0);
            if(rc == LIBSSH2_ERROR_EAGAIN)
                return _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                      "Would block");
            if(rc) {
                _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                               "Unable to send userauth-keyboard-interactive"
                               " request");
                goto cleanup;
            }

            session->userauth_kybd_auth_failure = 0;
        }

cleanup:
        /*
         * It's safe to clean all the data here, because unallocated pointers
         * are filled by zeroes
         */

        LIBSSH2_FREE(session, session->userauth_kybd_data);
        session->userauth_kybd_data = NULL;

        if(session->userauth_kybd_prompts) {
            for(i = 0; i < session->userauth_kybd_num_prompts; i++) {
                LIBSSH2_FREE(session, session->userauth_kybd_prompts[i].text);
                session->userauth_kybd_prompts[i].text = NULL;
            }
        }

        if(session->userauth_kybd_responses) {
            for(i = 0; i < session->userauth_kybd_num_prompts; i++) {
                LIBSSH2_FREE(session,
                             session->userauth_kybd_responses[i].text);
                session->userauth_kybd_responses[i].text = NULL;
            }
        }

        if(session->userauth_kybd_prompts) {
            LIBSSH2_FREE(session, session->userauth_kybd_prompts);
            session->userauth_kybd_prompts = NULL;
        }
        if(session->userauth_kybd_responses) {
            LIBSSH2_FREE(session, session->userauth_kybd_responses);
            session->userauth_kybd_responses = NULL;
        }
        if(session->userauth_kybd_auth_name) {
            LIBSSH2_FREE(session, session->userauth_kybd_auth_name);
            session->userauth_kybd_auth_name = NULL;
        }
        if(session->userauth_kybd_auth_instruction) {
            LIBSSH2_FREE(session, session->userauth_kybd_auth_instruction);
            session->userauth_kybd_auth_instruction = NULL;
        }

        if(session->userauth_kybd_auth_failure) {
            session->userauth_kybd_state = libssh2_NB_state_idle;
            return -1;
        }

        session->userauth_kybd_state = libssh2_NB_state_sent;
    }
}